

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O0

bool duckdb::Equals::Operation<double>(double *left,double *right)

{
  bool bVar1;
  double in_RSI;
  double in_RDI;
  
  bVar1 = EqualsFloat<double>(in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool Equals::Operation(const double &left, const double &right) {
	return EqualsFloat<double>(left, right);
}